

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oracle.cc
# Opt level: O1

void __thiscall parser::KOracle::load_oracle(KOracle *this,string *file,bool is_training)

{
  Dict *pDVar1;
  char cVar2;
  size_type __n;
  char cVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  istream *piVar7;
  long lVar8;
  undefined7 in_register_00000011;
  int *__args;
  char *pcVar9;
  int iVar10;
  vector<int,_std::allocator<int>_> cur_acts;
  int kTERM_INT;
  int kSHIFT_INT;
  int kREDUCE_INT;
  string line;
  string word;
  string kREDUCE;
  string kTERM;
  string kSHIFT;
  istrstream istr;
  compressed_ifstream in;
  vector<int,_std::allocator<int>_> local_608;
  Sentence *local_5f0;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  string local_5d8;
  int local_5b4;
  value_type local_5b0;
  undefined1 *local_590;
  size_t local_588;
  undefined1 local_580 [16];
  KOracle *local_570;
  KOracle *local_568;
  undefined1 *local_560;
  size_t local_558;
  undefined1 local_550 [16];
  undefined1 *local_540;
  size_t local_538;
  undefined1 local_530 [16];
  istream local_520;
  undefined1 local_3b0 [536];
  filtering_streambuf<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
  local_198;
  undefined8 local_138 [33];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Loading top-down oracle from ",0x1d);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(file->_M_dataplus)._M_p,file->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
  pcVar9 = "non-training";
  local_5b4 = (int)CONCAT71(in_register_00000011,is_training);
  if (local_5b4 != 0) {
    pcVar9 = "training";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,(ulong)!is_training * 4 + 8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ...\n",6);
  std::__cxx11::string::string
            ((string *)&local_520,(file->_M_dataplus)._M_p,(allocator *)&local_590);
  cnn::compressed_ifstream::compressed_ifstream
            ((compressed_ifstream *)local_3b0,(string *)&local_520);
  if (local_520._vptr_basic_istream != (_func_int **)&local_520.field_0x10) {
    operator_delete(local_520._vptr_basic_istream);
  }
  if (((byte)(*(_func_int **)(local_3b0._0_8_ + -0x18))[(long)(local_3b0 + 0x20)] & 5) != 0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/impl/oracle.cc"
                  ,0x2e,"void parser::KOracle::load_oracle(const string &, bool)");
  }
  local_590 = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"REDUCE","");
  local_540 = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"SHIFT","");
  local_560 = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"TERM","");
  pDVar1 = *(Dict **)(this + 0x10);
  local_520._vptr_basic_istream = (_func_int **)&local_520.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"REDUCE","");
  local_5dc = cnn::Dict::Convert(pDVar1,(string *)&local_520);
  if (local_520._vptr_basic_istream != (_func_int **)&local_520.field_0x10) {
    operator_delete(local_520._vptr_basic_istream);
  }
  pDVar1 = *(Dict **)(this + 0x10);
  local_520._vptr_basic_istream = (_func_int **)&local_520.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"SHIFT","");
  local_5e0 = cnn::Dict::Convert(pDVar1,(string *)&local_520);
  if (local_520._vptr_basic_istream != (_func_int **)&local_520.field_0x10) {
    operator_delete(local_520._vptr_basic_istream);
  }
  pDVar1 = *(Dict **)(this + 0x10);
  local_520._vptr_basic_istream = (_func_int **)&local_520.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"TERM","");
  local_5e4 = cnn::Dict::Convert(pDVar1,(string *)&local_520);
  if (local_520._vptr_basic_istream != (_func_int **)&local_520.field_0x10) {
    operator_delete(local_520._vptr_basic_istream);
  }
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  local_5d8._M_string_length = 0;
  local_5d8.field_2._M_local_buf[0] = '\0';
  local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_568 = this + 0x40;
  local_570 = this + 0x58;
  iVar10 = 0;
  do {
    do {
      iVar5 = iVar10;
      cVar2 = (char)(compressed_ifstream *)local_3b0;
      cVar3 = std::ios::widen((char)*(_func_int **)(local_3b0._0_8_ + -0x18) + cVar2);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3b0,(string *)&local_5d8,cVar3);
      if (((&piVar7->field_0x20)[(long)piVar7->_vptr_basic_istream[-3]] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Loaded ",7);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," sentences\n",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"    cumulative      action vocab size: ",0x27);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"    cumulative    terminal vocab size: ",0x27);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"    cumulative nonterminal vocab size: ",0x27);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"    cumulative         pos vocab size: ",0x27);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if (local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p);
        }
        if (local_560 != local_550) {
          operator_delete(local_560);
        }
        if (local_540 != local_530) {
          operator_delete(local_540);
        }
        if (local_590 != local_580) {
          operator_delete(local_590);
        }
        local_3b0._0_8_ = cnn::compressed_ifstream::vtable + 0x18;
        local_138[0] = 0x302dd0;
        boost::iostreams::
        filtering_streambuf<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
        ::~filtering_streambuf
                  ((filtering_streambuf<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                    *)(local_3b0 + 0x218));
        std::ifstream::~ifstream(local_3b0 + 0x10);
        local_3b0._0_8_ = std::istream-in-cnn::compressed_ifstream::construction_vtable + 0x18;
        local_138[0] = 0x302e20;
        local_3b0._8_8_ = 0;
        std::ios_base::~ios_base((ios_base *)local_138);
        return;
      }
      if (local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      iVar10 = iVar5 + 1;
    } while ((local_5d8._M_string_length == 0) ||
            ((*local_5d8._M_dataplus._M_p == '#' && (local_5d8._M_dataplus._M_p[2] == '('))));
    std::vector<parser::Sentence,_std::allocator<parser::Sentence>_>::resize
              ((vector<parser::Sentence,_std::allocator<parser::Sentence>_> *)local_568,
               (*(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3) * -0x1111111111111111 + 1);
    lVar8 = *(long *)(this + 0x48);
    local_5f0 = (Sentence *)(lVar8 + -0x78);
    if ((char)local_5b4 == '\0') {
      Oracle::ReadSentenceView
                (&local_5d8,*(Dict **)(this + 0x18),
                 (vector<int,_std::allocator<int>_> *)(lVar8 + -0x30));
      cVar3 = std::ios::widen((char)*(_func_int **)(local_3b0._0_8_ + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3b0,(string *)&local_5d8,cVar3);
      std::istrstream::istrstream((istrstream *)&local_520,local_5d8._M_dataplus._M_p);
      local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
      local_5b0._M_string_length = 0;
      local_5b0.field_2._M_local_buf[0] = '\0';
      while (piVar7 = std::operator>>(&local_520,(string *)&local_5b0),
            ((&piVar7->field_0x20)[(long)piVar7->_vptr_basic_istream[-3]] & 5) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(lVar8 + -0x18),&local_5b0);
      }
      cVar3 = std::ios::widen((char)*(_func_int **)(local_3b0._0_8_ + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3b0,(string *)&local_5d8,cVar3);
      Oracle::ReadSentenceView
                (&local_5d8,*(Dict **)(this + 8),
                 (vector<int,_std::allocator<int>_> *)(lVar8 + -0x48));
      cVar3 = std::ios::widen((char)*(_func_int **)(local_3b0._0_8_ + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3b0,(string *)&local_5d8,cVar3);
      Oracle::ReadSentenceView
                (&local_5d8,*(Dict **)(this + 8),
                 (vector<int,_std::allocator<int>_> *)(lVar8 + -0x60));
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_5f0->raw,(vector<int,_std::allocator<int>_> *)(lVar8 + -0x60));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
        operator_delete(local_5b0._M_dataplus._M_p);
      }
      std::istrstream::~istrstream((istrstream *)&local_520);
    }
    else {
      Oracle::ReadSentenceView
                (&local_5d8,*(Dict **)(this + 0x18),
                 (vector<int,_std::allocator<int>_> *)(lVar8 + -0x30));
      cVar3 = std::ios::widen((char)*(_func_int **)(local_3b0._0_8_ + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3b0,(string *)&local_5d8,cVar3);
      Oracle::ReadSentenceView(&local_5d8,*(Dict **)(this + 8),&local_5f0->raw);
      cVar3 = std::ios::widen((char)*(_func_int **)(local_3b0._0_8_ + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3b0,(string *)&local_5d8,cVar3);
      Oracle::ReadSentenceView
                (&local_5d8,*(Dict **)(this + 8),
                 (vector<int,_std::allocator<int>_> *)(lVar8 + -0x48));
      cVar3 = std::ios::widen((char)*(_func_int **)(local_3b0._0_8_ + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3b0,(string *)&local_5d8,cVar3);
      Oracle::ReadSentenceView
                (&local_5d8,*(Dict **)(this + 8),
                 (vector<int,_std::allocator<int>_> *)(lVar8 + -0x60));
    }
    iVar10 = iVar5 + 4;
    bVar4 = Sentence::SizesMatch(local_5f0);
    if (!bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Mismatched lengths of input strings in oracle before line ",
                 0x3a);
      poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,iVar10);
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_001a1cdc;
    }
    local_5f0 = (Sentence *)((ulong)local_5f0 & 0xffffffff00000000);
    while( true ) {
      cVar3 = std::ios::widen((char)*(_func_int **)(local_3b0._0_8_ + -0x18) + cVar2);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3b0,(string *)&local_5d8,cVar3);
      if (((&piVar7->field_0x20)[(long)piVar7->_vptr_basic_istream[-3]] & 5) != 0) break;
      if (local_5d8._M_string_length == 0) {
        iVar10 = iVar10 + 1;
        break;
      }
      lVar8 = std::__cxx11::string::find((char)&local_5d8,0x20);
      if (lVar8 != -1) {
        __assert_fail("line.find(\' \') == string::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/impl/oracle.cc"
                      ,0x5d,"void parser::KOracle::load_oracle(const string &, bool)");
      }
      if ((local_5d8._M_string_length == local_588) &&
         ((local_5d8._M_string_length == 0 ||
          (iVar5 = bcmp(local_5d8._M_dataplus._M_p,local_590,local_5d8._M_string_length), iVar5 == 0
          )))) {
        iVar5 = local_5dc;
        if (local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_001a18dc;
        __args = &local_5dc;
LAB_001a18f5:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_608,
                   (iterator)
                   local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
LAB_001a190e:
        iVar10 = iVar10 + 1;
      }
      else {
        lVar8 = std::__cxx11::string::find((char *)&local_5d8,0x2828fe,0);
        __n = local_5d8._M_string_length;
        if (lVar8 == 0) {
          pDVar1 = *(Dict **)(this + 0x70);
          std::__cxx11::string::substr((ulong)&local_520,(ulong)&local_5d8);
          cnn::Dict::Convert(pDVar1,(string *)&local_520);
          if (local_520._vptr_basic_istream != (_func_int **)&local_520.field_0x10) {
            operator_delete(local_520._vptr_basic_istream);
          }
          iVar5 = cnn::Dict::Convert(*(Dict **)(this + 0x10),&local_5d8);
          local_520._vptr_basic_istream =
               (_func_int **)CONCAT44(local_520._vptr_basic_istream._4_4_,iVar5);
          if (local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_608,
                       (iterator)
                       local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_520);
            goto LAB_001a190e;
          }
LAB_001a18dc:
          *local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
          goto LAB_001a190e;
        }
        if ((local_5d8._M_string_length != local_538) ||
           ((local_5d8._M_string_length != 0 &&
            (iVar5 = bcmp(local_5d8._M_dataplus._M_p,local_540,local_5d8._M_string_length),
            iVar5 != 0)))) {
          if ((__n == local_558) &&
             ((__n == 0 || (iVar5 = bcmp(local_5d8._M_dataplus._M_p,local_560,__n), iVar5 == 0)))) {
            iVar5 = local_5e4;
            if (local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              __args = &local_5e4;
              goto LAB_001a18f5;
            }
            goto LAB_001a18dc;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Malformed input in line ",0x18);
          poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,iVar10 + 1);
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_001a1cdc;
        }
        if (local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_608,
                     (iterator)
                     local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_5e0);
        }
        else {
          *local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_5e0;
          local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_608.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar10 = iVar10 + 1;
        local_5f0 = (Sentence *)CONCAT44(local_5f0._4_4_,(int)local_5f0 + 1);
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_570,&local_608);
  } while (*(long *)(*(long *)(this + 0x48) + -0x70) - *(long *)(*(long *)(this + 0x48) + -0x78) >>
           2 == ((ulong)local_5f0 & 0xffffffff));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Mismatched number of tokens and SHIFTs in oracle before line ",
             0x3d);
  poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,iVar10);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_001a1cdc:
  abort();
}

Assistant:

void KOracle::load_oracle(const string& file, bool is_training) {
  cerr << "Loading top-down oracle from " << file << " [" << (is_training ? "training" : "non-training") << "] ...\n";
  cnn::compressed_ifstream in(file.c_str());
  assert(in);
  const string kREDUCE = "REDUCE";
  const string kSHIFT = "SHIFT";
  const string kTERM = "TERM";
  const int kREDUCE_INT = ad->Convert("REDUCE");
  const int kSHIFT_INT = ad->Convert("SHIFT");
  const int kTERM_INT = ad->Convert("TERM");
  int lc = 0;
  string line;
  vector<int> cur_acts;
  while(getline(in, line)) {
    ++lc;
    //cerr << "line number = " << lc << endl;
    cur_acts.clear();
    if (line.size() == 0 || (line[0] == '#' && line[2] == '(')) continue;
    sents.resize(sents.size() + 1);
    auto& cur_sent = sents.back();
    if (is_training) {  // at training time, we load both "UNKified" versions of the data, and raw versions
      ReadSentenceView(line, pd, &cur_sent.pos);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.raw);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.lc);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.unk);
    } else { // at test time, we ignore the raw strings and just use the "UNKified" versions
      ReadSentenceView(line, pd, &cur_sent.pos);
      getline(in, line);
      istrstream istr(line.c_str());
      string word;
      while(istr>>word) cur_sent.surfaces.push_back(word);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.lc);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.unk);
      cur_sent.raw = cur_sent.unk;
    }
    lc += 3;
    if (!cur_sent.SizesMatch()) {
      cerr << "Mismatched lengths of input strings in oracle before line " << lc << endl;
      abort();
    }
    int termc = 0;
    while(getline(in, line)) {
      ++lc;
      //cerr << "line number = " << lc << endl;
      if (line.size() == 0) break;
      assert(line.find(' ') == string::npos);
      if (line == kREDUCE) {
        cur_acts.push_back(kREDUCE_INT);
      } else if (line.find("PJ(") == 0) {
        // Convert NT
        nd->Convert(line.substr(3, line.size() - 4));
        // PJ(X) is put into the actions list as PJ(X)
        cur_acts.push_back(ad->Convert(line));
      } else if (line == kSHIFT) {
        cur_acts.push_back(kSHIFT_INT);
        termc++;
      } else if (line == kTERM){
	cur_acts.push_back(kTERM_INT);
      } else {
        cerr << "Malformed input in line " << lc << endl;
        abort();
      }
    }
    actions.push_back(cur_acts);
    if (termc != sents.back().size()) {
      cerr << "Mismatched number of tokens and SHIFTs in oracle before line " << lc << endl;
      abort();
    }
  }
  cerr << "Loaded " << sents.size() << " sentences\n";
  cerr << "    cumulative      action vocab size: " << ad->size() << endl;
  cerr << "    cumulative    terminal vocab size: " << d->size() << endl;
  cerr << "    cumulative nonterminal vocab size: " << nd->size() << endl;
  cerr << "    cumulative         pos vocab size: " << pd->size() << endl;
}